

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

void __thiscall
ddd::DaTrie<true,_true,_false>::rebuild_
          (DaTrie<true,_true,_false> *this,DaTrie<true,_true,_false> *rhs_trie)

{
  pair<unsigned_int,_unsigned_int> *ppVar1;
  byte bVar2;
  uint uVar3;
  pointer pBVar4;
  pointer pBVar5;
  Bc BVar6;
  pair<unsigned_int,_unsigned_int> pVar7;
  DaTrie<true,_true,_false> *pDVar8;
  uint32_t uVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  char *__s;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  np_stack;
  Query query;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_178;
  pair<unsigned_int,_unsigned_int> local_160;
  DaTrie<true,_true,_false> *local_158;
  vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *local_150;
  ulong local_148;
  size_t local_140;
  Edge local_138;
  
  pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  pBVar5 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar4 != pBVar5) {
    local_178.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pair<unsigned_int,_unsigned_int> *)0x0;
    local_178.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pair<unsigned_int,_unsigned_int> *)0x0;
    local_178.
    super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pair<unsigned_int,_unsigned_int> *)0x0;
    std::
    vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::reserve(&local_178,(ulong)((int)((ulong)((long)pBVar5 - (long)pBVar4) >> 3) - this->bc_emps_))
    ;
    local_138.labels_._0_8_ = (char *)0x0;
    if (local_178.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_178.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
      ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
                ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                  *)&local_178,
                 (iterator)
                 local_178.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (pair<unsigned_int,_unsigned_int> *)&local_138);
    }
    else {
      (local_178.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->first = 0;
      (local_178.
       super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->second = 0;
      local_178.
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_178.
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    local_150 = &rhs_trie->blocks_;
    fix_(rhs_trie,0,local_150);
    pBVar4 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
             super__Vector_impl_data._M_start;
    *pBVar4 = (Bc)((ulong)*pBVar4 | 0x7fffffff00000000);
    pDVar8 = rhs_trie;
    if (local_178.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_178.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        local_158 = pDVar8;
        ppVar1 = local_178.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
        uVar13 = local_178.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].first;
        uVar12 = (ulong)uVar13;
        uVar3 = local_178.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1].second;
        (rhs_trie->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar3] =
             (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>.
             _M_impl.super__Vector_impl_data._M_start[uVar12];
        pBVar4 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        BVar6 = pBVar4[uVar12];
        local_178.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppVar1;
        if ((int)BVar6._0_4_ < 0) {
          if ((uVar12 == 0) ||
             ((*(uint *)(&pBVar4->field_0x0 + ((ulong)BVar6 >> 0x1d & 0x3fffffff8)) & 0x7fffffff) !=
              uVar13)) {
            __s = (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start + (BVar6._0_4_ & 0x7fffffff);
            local_138.labels_[8] = '\0';
            local_138.labels_[9] = '\0';
            local_138.labels_[10] = '\0';
            local_138.labels_[0xb] = '\0';
            local_138.labels_[0xc] = 0xff;
            local_138.labels_[0xd] = 0xff;
            local_138.labels_[0xe] = 0xff;
            local_138.labels_[0xf] = '\x7f';
            local_138.labels_[0x10] = '\0';
            local_138.labels_[0x11] = '\0';
            local_138.labels_[0x12] = '\0';
            local_138.labels_[0x13] = '\0';
            local_138.labels_[0x14] = '\0';
            local_138.labels_._0_8_ = __s;
            sVar10 = strlen(__s);
            local_138.labels_._12_4_ = *(undefined4 *)(__s + ((int)sVar10 + 1));
            local_138.labels_._16_4_ = uVar3;
            insert_tail_(rhs_trie,(Query *)&local_138);
          }
          else {
            pBVar4 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pBVar4[uVar3] =
                 (Bc)((ulong)BVar6 & 0xffffffff | (ulong)pBVar4[uVar3] & 0xffffffff00000000);
          }
        }
        else {
          memset(&local_138,0,0x108);
          edge_(this,uVar13,&local_138,0x100);
          uVar9 = xcheck_(rhs_trie,&local_138,local_150);
          pBVar4 = (rhs_trie->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pBVar4[uVar3] =
               (Bc)((ulong)(uVar9 & 0x7fffffff) | (ulong)pBVar4[uVar3] & 0xffffffff00000000);
          local_140 = local_138.size_;
          rhs_trie = local_158;
          if (local_138.size_ != 0) {
            local_148 = (ulong)(uVar3 & 0x7fffffff) << 0x20;
            sVar11 = 0;
            do {
              pDVar8 = local_158;
              bVar2 = local_138.labels_[sVar11];
              uVar13 = uVar9 ^ bVar2;
              fix_(local_158,uVar13,local_150);
              pBVar4 = (pDVar8->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pBVar4[uVar13] = (Bc)((ulong)pBVar4[uVar13] & 0x80000000ffffffff | local_148);
              local_160.first =
                   *(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar12) & 0x7fffffff ^
                   (uint)bVar2;
              local_160.second = uVar13;
              if (local_178.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  local_178.
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::
                vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
                          ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                            *)&local_178,
                           (iterator)
                           local_178.
                           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,&local_160);
              }
              else {
                pVar7.second = uVar13;
                pVar7.first = local_160.first;
                *local_178.
                 super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish = pVar7;
                local_178.
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     local_178.
                     super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 1;
              }
              sVar11 = sVar11 + 1;
              rhs_trie = local_158;
            } while (local_140 != sVar11);
          }
        }
        pDVar8 = local_158;
      } while (local_178.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_178.
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_178.
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pair<unsigned_int,_unsigned_int> *)0x0) {
      operator_delete(local_178.
                      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void rebuild_(DaTrie& rhs_trie) const {
    assert(rhs_trie.is_empty());

    if (is_empty()) {
      return;
    }

    using NodePair = std::pair<uint32_t, uint32_t>;

    std::vector<NodePair> np_stack;
    np_stack.reserve(num_nodes());
    np_stack.push_back({ROOT_POS, ROOT_POS});

    rhs_trie.fix_(ROOT_POS, rhs_trie.blocks_);
    rhs_trie.bc_[ROOT_POS].set_check(INVALID_VALUE);

    while (!np_stack.empty()) {
      const NodePair node_pair = np_stack.back();
      np_stack.pop_back();

      if (WithNLM) {
        rhs_trie.node_links_[node_pair.second] = node_links_[node_pair.first];
      }

      if (bc_[node_pair.first].is_leaf()) {
        if (is_terminal_(node_pair.first)) {
          rhs_trie.bc_[node_pair.second].set_value(bc_[node_pair.first].value());
        } else {
          auto tail = tail_.data() + bc_[node_pair.first].value();
          Query query(tail);
          query.set_value(utils::extract_value(tail + utils::length(tail)));
          query.set_node_pos(node_pair.second);
          rhs_trie.insert_tail_(query);
        }
        continue;
      }

      Edge edge;
      edge_(node_pair.first, edge);

      auto rhs_base = rhs_trie.xcheck_(edge, rhs_trie.blocks_);
      rhs_trie.bc_[node_pair.second].set_base(rhs_base);

      for (auto label : edge) {
        auto rhs_child_pos = rhs_base ^label;
        rhs_trie.fix_(rhs_child_pos, rhs_trie.blocks_);
        rhs_trie.bc_[rhs_child_pos].set_check(node_pair.second);
        np_stack.push_back({bc_[node_pair.first].base() ^ label, rhs_child_pos});
      }
    }
  }